

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_bitfield_insert_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,uint32_t op3,char *op,BaseType offset_count_type)

{
  bool bVar1;
  SPIRType *pSVar2;
  uint32_t id;
  bool local_2a9;
  spirv_cross local_2a8 [32];
  undefined1 local_288 [64];
  undefined1 local_248 [64];
  undefined1 local_208 [8];
  SPIRType target_type;
  string op3_expr;
  undefined1 local_98 [8];
  string op2_expr;
  undefined1 local_68 [8];
  string op1_expr;
  undefined1 local_48 [8];
  string op0_expr;
  bool forward;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  bVar1 = should_forward(this,op0);
  local_2a9 = false;
  if (bVar1) {
    bVar1 = should_forward(this,op1);
    local_2a9 = false;
    if (bVar1) {
      bVar1 = should_forward(this,op2);
      local_2a9 = false;
      if (bVar1) {
        local_2a9 = should_forward(this,op3);
      }
    }
  }
  id = (uint32_t)this;
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_48,id,SUB41(op0,0));
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_68,id,SUB41(op1,0));
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_98,id,SUB41(op2,0));
  to_unpacked_expression_abi_cxx11_
            ((CompilerGLSL *)&target_type.member_name_cache._M_h._M_single_bucket,id,SUB41(op3,0));
  SPIRType::SPIRType((SPIRType *)local_208);
  target_type.super_IVariant._12_4_ = 1;
  target_type.super_IVariant._vptr_IVariant._4_4_ = offset_count_type;
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op2);
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc != offset_count_type) {
    type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_248,(SPIRType *)this);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((spirv_cross *)(local_248 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
               (char (*) [2])0x601bd3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               (char (*) [2])0x5eaa1a);
    ::std::__cxx11::string::operator=((string *)local_98,(string *)(local_248 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_248 + 0x20));
    ::std::__cxx11::string::~string((string *)local_248);
  }
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op3);
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc != offset_count_type) {
    type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_288,(SPIRType *)this);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((spirv_cross *)(local_288 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
               (char (*) [2])0x601bd3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &target_type.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x5eaa1a);
    ::std::__cxx11::string::operator=
              ((string *)&target_type.member_name_cache._M_h._M_single_bucket,
               (string *)(local_288 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_288 + 0x20));
    ::std::__cxx11::string::~string((string *)local_288);
  }
  join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
            (local_2a8,&op,(char (*) [2])0x601bd3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [3])0x5fe6df,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (char (*) [3])0x5fe6df,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             (char (*) [3])0x5fe6df,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &target_type.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x5eaa1a);
  emit_op(this,result_type,result_id,(string *)local_2a8,local_2a9,false);
  ::std::__cxx11::string::~string((string *)local_2a8);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op3);
  SPIRType::~SPIRType((SPIRType *)local_208);
  ::std::__cxx11::string::~string((string *)&target_type.member_name_cache._M_h._M_single_bucket);
  ::std::__cxx11::string::~string((string *)local_98);
  ::std::__cxx11::string::~string((string *)local_68);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void CompilerGLSL::emit_bitfield_insert_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                           uint32_t op2, uint32_t op3, const char *op,
                                           SPIRType::BaseType offset_count_type)
{
	// Only need to cast offset/count arguments. Types of base/insert must be same as result type,
	// and bitfieldInsert is sign invariant.
	bool forward = should_forward(op0) && should_forward(op1) && should_forward(op2) && should_forward(op3);

	auto op0_expr = to_unpacked_expression(op0);
	auto op1_expr = to_unpacked_expression(op1);
	auto op2_expr = to_unpacked_expression(op2);
	auto op3_expr = to_unpacked_expression(op3);

	SPIRType target_type;
	target_type.vecsize = 1;
	target_type.basetype = offset_count_type;

	if (expression_type(op2).basetype != offset_count_type)
	{
		// Value-cast here. Input might be 16-bit. GLSL requires int.
		op2_expr = join(type_to_glsl_constructor(target_type), "(", op2_expr, ")");
	}

	if (expression_type(op3).basetype != offset_count_type)
	{
		// Value-cast here. Input might be 16-bit. GLSL requires int.
		op3_expr = join(type_to_glsl_constructor(target_type), "(", op3_expr, ")");
	}

	emit_op(result_type, result_id, join(op, "(", op0_expr, ", ", op1_expr, ", ", op2_expr, ", ", op3_expr, ")"),
	        forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
	inherit_expression_dependencies(result_id, op3);
}